

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O2

uint pseudo_median<unsigned_int>(uint *begin,uint *end)

{
  uint uVar1;
  uint b;
  uint c;
  long lVar2;
  ulong uVar3;
  
  lVar2 = (long)end - (long)begin;
  if (3 < (ulong)(lVar2 >> 2)) {
    uVar1 = med3char<unsigned_int>(*begin,begin[1],begin[2]);
    uVar3 = lVar2 >> 2 & 0xfffffffffffffffe;
    b = med3char<unsigned_int>
                  (*(uint *)((long)begin + uVar3 * 2),*(uint *)((long)begin + uVar3 * 2 + 4),
                   *(uint *)((long)begin + uVar3 * 2 + 8));
    c = med3char<unsigned_int>
                  (*(uint *)((long)begin + lVar2 + -0xc),*(uint *)((long)begin + lVar2 + -8),
                   *(uint *)((long)begin + lVar2 + -4));
    uVar1 = med3char<unsigned_int>(uVar1,b,c);
    return uVar1;
  }
  __assert_fail("N>3",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/median.h"
                ,0x41,"CharT pseudo_median(CharT *, CharT *) [CharT = unsigned int]");
}

Assistant:

inline CharT
pseudo_median(CharT* begin, CharT* end)
{
	size_t N=end-begin;
	assert(N>3);
	return med3char(
			med3char(begin[0],   begin[1],     begin[2]),
			med3char(begin[N/2], begin[N/2+1], begin[N/2+2]),
			med3char(begin[N-3], begin[N-2],   begin[N-1])
		       );
}